

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack3_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar13 [64];
  
  auVar8 = vpmovsxbd_avx512f(_DAT_0018d910);
  auVar9 = vpmovsxbd_avx512f(_DAT_0018d920);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar6 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar6,_DAT_001960c0);
  auVar5 = vpbroadcastd_avx512vl();
  auVar1 = vpinsrd_avx(auVar5,*in,0);
  auVar2 = vpsrlvd_avx2(auVar5,_DAT_00199390);
  auVar5 = vpinsrd_avx(auVar1,(int)*(ulong *)(in + 1) * 4,1);
  auVar3 = vpsrlvd_avx2(auVar1,_DAT_00199380);
  auVar1._8_4_ = 4;
  auVar1._0_8_ = 0x400000004;
  auVar1._12_4_ = 4;
  auVar5 = vpandd_avx512vl(auVar5,auVar1);
  auVar8 = vpermi2d_avx512f(auVar8,ZEXT3264(auVar4),ZEXT3264(auVar6));
  auVar11 = vpbroadcastd_avx512f(ZEXT416(7));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 1);
  auVar1 = vpshufd_avx(auVar14,0x50);
  auVar5 = vpblendd_avx2(auVar3,auVar5,2);
  auVar4 = vpermq_avx2(ZEXT1632(auVar1),0x40);
  auVar6 = vpsrlvd_avx2(auVar4,_DAT_001960e0);
  auVar8 = vpermi2d_avx512f(auVar9,auVar8,ZEXT1664(auVar5));
  auVar9 = vmovdqa64_avx512f(auVar8);
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_52_ = auVar9._0_52_;
  auVar13._52_4_ = auVar12._52_4_;
  auVar13._56_4_ = auVar9._56_4_;
  auVar13._60_4_ = auVar9._60_4_;
  auVar9 = vpermi2q_avx512f(auVar10,auVar13,ZEXT1664(auVar2));
  auVar4 = vpand_avx2(auVar6,auVar11._0_32_);
  auVar9 = vpandd_avx512f(auVar9,auVar11);
  auVar10 = vpbroadcastd_avx512f();
  auVar12._0_40_ = auVar11._0_40_;
  auVar12._40_4_ = auVar10._40_4_;
  auVar12._44_4_ = auVar11._44_4_;
  auVar12._48_4_ = auVar11._48_4_;
  auVar12._52_4_ = auVar11._52_4_;
  auVar12._56_4_ = auVar11._56_4_;
  auVar12._60_4_ = auVar11._60_4_;
  auVar8 = vpord_avx512f(auVar8,auVar12);
  auVar10._0_40_ = auVar9._0_40_;
  auVar10._40_4_ = auVar8._40_4_;
  auVar10._44_4_ = auVar9._44_4_;
  auVar10._48_4_ = auVar9._48_4_;
  auVar10._52_4_ = auVar9._52_4_;
  auVar10._56_4_ = auVar9._56_4_;
  auVar10._60_4_ = auVar9._60_4_;
  auVar7 = vpbroadcastd_avx512vl();
  auVar6 = vpor_avx2(auVar6,auVar7);
  auVar8 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])out = auVar8;
  auVar4 = vpblendd_avx2(auVar4,auVar6,0x20);
  *(undefined1 (*) [32])(out + 0x10) = auVar4;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack3_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;
  *out = ((*in) >> 16) % (1U << 3);
  out++;
  *out = ((*in) >> 19) % (1U << 3);
  out++;
  *out = ((*in) >> 22) % (1U << 3);
  out++;
  *out = ((*in) >> 25) % (1U << 3);
  out++;
  *out = ((*in) >> 28) % (1U << 3);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 2)) << (3 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 3);
  out++;
  *out = ((*in) >> 5) % (1U << 3);
  out++;

  return in + 1;
}